

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roots.cpp
# Opt level: O1

vector<double,_std::allocator<double>_> *
opengv::math::o4_roots
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          vector<double,_std::allocator<double>_> *p)

{
  double *pdVar1;
  iterator iVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  undefined8 extraout_XMM0_Qb;
  double dVar8;
  complex<double> P;
  complex<double> Q;
  complex<double> R;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  undefined8 uStack_90;
  double local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  double local_68 [2];
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  double local_40;
  double local_38 [2];
  complex<double> local_28;
  
  pdVar1 = (p->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  local_a0 = *pdVar1;
  local_78 = pdVar1[1];
  dVar7 = pdVar1[2];
  dVar8 = local_a0 * local_a0;
  dVar3 = local_78 * local_78;
  dVar4 = local_a0 * dVar8;
  local_b0 = dVar7 / local_a0 - (dVar3 * 3.0) / (dVar8 * 8.0);
  local_80 = pdVar1[3] / local_a0 +
             ((local_78 * dVar3) / (dVar4 * 8.0) - (local_78 * dVar7) / (dVar8 + dVar8));
  dVar7 = pdVar1[4] / local_a0 +
          (dVar3 * dVar7) / (dVar4 * 16.0) +
          (local_78 * local_78 * dVar3 * 3.0) / (local_a0 * dVar4 * -256.0) +
          (local_78 * pdVar1[3]) / (dVar8 * -4.0);
  local_68[0] = (local_b0 * local_b0) / -12.0 - dVar7;
  local_68[1] = 0.0;
  dVar8 = local_80 * local_80 * -0.125;
  local_38[0] = (local_b0 * dVar7) / 3.0 + (local_b0 * local_b0 * local_b0) / -108.0 + dVar8;
  local_38[1] = 0.0;
  dVar7 = local_38[0] * -0.5;
  local_c0 = 2.0;
  local_98 = dVar7;
  std::pow<double>((complex<double> *)local_38,&local_c0);
  local_b8 = dVar7 * 0.25;
  dVar7 = dVar8 * 0.25;
  local_40 = 3.0;
  local_a8 = dVar7;
  std::pow<double>((complex<double> *)local_68,&local_40);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = dVar8 / 27.0 + local_a8;
  dVar7 = csqrt(dVar7 / 27.0 + local_b8);
  dVar7 = dVar7 + local_98;
  local_28._M_value._8_8_ = auVar6._0_8_;
  local_c0 = 0.3333333333333333;
  local_28._M_value._0_8_ = dVar7;
  std::pow<double>(&local_28,&local_c0);
  if ((dVar7 != 0.0) || (NAN(dVar7))) {
    local_98 = (local_b0 * -5.0) / 6.0;
    local_b8 = auVar6._0_8_;
    local_a8 = dVar7;
    auVar6 = __divdc3(local_68[0],local_68[1],dVar7 * 3.0,local_b8 * 3.0);
    dVar7 = (local_98 - auVar6._0_8_) + local_a8;
    dVar8 = local_b8 - auVar6._8_8_;
  }
  else {
    dVar7 = (local_b0 * -5.0) / 6.0;
    local_c0 = 0.3333333333333333;
    local_98 = dVar7;
    std::pow<double>((complex<double> *)local_38,&local_c0);
    auVar5._8_8_ = 0x8000000000000000;
    auVar5._0_8_ = 0x8000000000000000;
    auVar6 = vxorpd_avx512vl(auVar6,auVar5);
    dVar8 = auVar6._0_8_;
    dVar7 = local_98 - dVar7;
  }
  local_b8 = dVar7 + dVar7;
  dVar8 = dVar8 + dVar8;
  local_a8 = dVar8;
  local_98 = csqrt(local_b8 + local_b0);
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a0 = local_78 / (local_a0 * -4.0);
  local_b0 = local_b0 * 3.0 + local_b8;
  local_b8 = local_80 + local_80;
  uStack_90 = extraout_XMM0_Qb;
  local_80 = dVar8;
  dVar7 = (double)__divdc3(local_b8,0,local_98);
  local_78 = -0.0;
  uStack_70 = 0x8000000000000000;
  dVar7 = csqrt(-(dVar7 + local_b0));
  local_c0 = (dVar7 + local_98) * 0.5 + local_a0;
  iVar2._M_current =
       (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (__return_storage_ptr__,iVar2,&local_c0);
  }
  else {
    *iVar2._M_current = local_c0;
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  dVar7 = (double)__divdc3(local_b8,0,local_98,local_80);
  dVar7 = csqrt((double)((ulong)(dVar7 + local_b0) ^ (ulong)local_78));
  local_c0 = (local_98 - dVar7) * 0.5 + local_a0;
  iVar2._M_current =
       (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (__return_storage_ptr__,iVar2,&local_c0);
  }
  else {
    *iVar2._M_current = local_c0;
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  dVar7 = (double)__divdc3(local_b8,0,local_98,local_80);
  dVar7 = csqrt((double)((ulong)(local_b0 - dVar7) ^ (ulong)local_78));
  local_c0 = (dVar7 - local_98) * 0.5 + local_a0;
  iVar2._M_current =
       (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (__return_storage_ptr__,iVar2,&local_c0);
  }
  else {
    *iVar2._M_current = local_c0;
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  local_58 = SUB84(local_98,0) ^ (uint)local_78;
  uStack_54 = (uint)((ulong)local_98 >> 0x20) ^ local_78._4_4_;
  uStack_50 = (uint)uStack_90 ^ (uint)uStack_70;
  uStack_4c = (uint)((ulong)uStack_90 >> 0x20) ^ uStack_70._4_4_;
  dVar7 = (double)__divdc3(local_b8,0,local_98,local_80);
  dVar7 = csqrt((double)((ulong)(local_b0 - dVar7) ^ (ulong)local_78));
  local_c0 = ((double)CONCAT44(uStack_54,local_58) - dVar7) * 0.5 + local_a0;
  iVar2._M_current =
       (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (__return_storage_ptr__,iVar2,&local_c0);
  }
  else {
    *iVar2._M_current = local_c0;
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<double>
opengv::math::o4_roots( const std::vector<double> & p )
{
  double A = p[0];
  double B = p[1];
  double C = p[2];
  double D = p[3];
  double E = p[4];

  double A_pw2 = A*A;
  double B_pw2 = B*B;
  double A_pw3 = A_pw2*A;
  double B_pw3 = B_pw2*B;
  double A_pw4 = A_pw3*A;
  double B_pw4 = B_pw3*B;

  double alpha = -3*B_pw2/(8*A_pw2)+C/A;
  double beta = B_pw3/(8*A_pw3)-B*C/(2*A_pw2)+D/A;
  double gamma = -3*B_pw4/(256*A_pw4)+B_pw2*C/(16*A_pw3)-B*D/(4*A_pw2)+E/A;

  double alpha_pw2 = alpha*alpha;
  double alpha_pw3 = alpha_pw2*alpha;

  std::complex<double> P (-alpha_pw2/12-gamma,0);
  std::complex<double> Q (-alpha_pw3/108+alpha*gamma/3-pow(beta,2)/8,0);
  std::complex<double> R = -Q/2.0+sqrt(pow(Q,2.0)/4.0+pow(P,3.0)/27.0);

  std::complex<double> U = pow(R,(1.0/3.0));
  std::complex<double> y;

  if (U.real() == 0)
    y = -5.0*alpha/6.0-pow(Q,(1.0/3.0));
  else
    y = -5.0*alpha/6.0-P/(3.0*U)+U;

  std::complex<double> w = sqrt(alpha+2.0*y);

  std::vector<double> realRoots;
  std::complex<double> temp;
  temp = -B/(4.0*A) + 0.5*(w+sqrt(-(3.0*alpha+2.0*y+2.0*beta/w)));
  realRoots.push_back(temp.real());
  temp = -B/(4.0*A) + 0.5*(w-sqrt(-(3.0*alpha+2.0*y+2.0*beta/w)));
  realRoots.push_back(temp.real());
  temp = -B/(4.0*A) + 0.5*(-w+sqrt(-(3.0*alpha+2.0*y-2.0*beta/w)));
  realRoots.push_back(temp.real());
  temp = -B/(4.0*A) + 0.5*(-w-sqrt(-(3.0*alpha+2.0*y-2.0*beta/w)));
  realRoots.push_back(temp.real());

  return realRoots;
}